

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O1

loader_handle mock_loader_impl_load_from_file(loader_impl impl,loader_path *paths,size_t size)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)malloc(8);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)0x0;
  }
  else {
    if (size != 0) {
      do {
        log_write_impl_va("metacall",0x154,"mock_loader_impl_load_from_file",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"Mock module %s loaded from file",paths);
        paths = paths + 1;
        size = size - 1;
      } while (size != 0);
    }
    *puVar1 = 0;
  }
  return puVar1;
}

Assistant:

loader_handle mock_loader_impl_load_from_file(loader_impl impl, const loader_path paths[], size_t size)
{
	loader_impl_mock_handle handle = malloc(sizeof(struct loader_impl_mock_handle_type));

	(void)impl;

	if (handle != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			log_write("metacall", LOG_LEVEL_DEBUG, "Mock module %s loaded from file", paths[iterator]);
		}

		handle->handle_mock_data = NULL;

		return (loader_handle)handle;
	}

	return NULL;
}